

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack13_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  
  auVar10 = *(undefined1 (*) [16])in;
  auVar5 = vpmovsxbd_avx2(ZEXT816(0x302020201010000));
  auVar11._8_4_ = 0x1fff;
  auVar11._0_8_ = 0x1fff00001fff;
  auVar11._12_4_ = 0x1fff;
  auVar12._16_4_ = 0x1fff;
  auVar12._0_16_ = auVar11;
  auVar12._20_4_ = 0x1fff;
  auVar12._24_4_ = 0x1fff;
  auVar12._28_4_ = 0x1fff;
  uVar8 = in[1];
  auVar4 = vpmovsxbd_avx(ZEXT416(0x501));
  uVar1 = in[3];
  *out = *in & 0x1fff;
  uVar2 = in[6];
  auVar5 = vpermd_avx2(auVar5,ZEXT1632(auVar10));
  auVar9._8_8_ = *(undefined8 *)(in + 2);
  auVar9._0_8_ = *(undefined8 *)(in + 2);
  auVar6 = vpsrlvd_avx2(auVar5,_DAT_0019aae0);
  auVar10 = vpinsrd_avx(auVar11,(uVar8 & 0x7f) << 6,1);
  uVar3 = *(ulong *)(in + 4);
  auVar9 = vpsllvd_avx2(auVar9,_DAT_001aa870);
  auVar7._8_8_ = 0x1fe000001000;
  auVar7._0_8_ = 0x1fe000001000;
  auVar9 = vpandq_avx512vl(auVar9,auVar7);
  auVar10 = vpermi2d_avx512vl(auVar4,auVar9,auVar10);
  auVar5 = vpand_avx2(auVar6,auVar12);
  auVar12 = vpermq_avx2(ZEXT1632(auVar10),0x24);
  auVar12 = vpor_avx2(auVar6,auVar12);
  auVar5 = vpblendd_avx2(auVar5,auVar12,0x4a);
  *(undefined1 (*) [32])(out + 1) = auVar5;
  out[9] = uVar1 >> 0x15 | ((uint)uVar3 & 3) << 0xb;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar3;
  auVar10 = vpshufd_avx(auVar10,0x40);
  auVar9 = vpsrlvd_avx2(auVar10,_DAT_001aa890);
  uVar8 = (uint)(uVar3 >> 0x20);
  auVar4 = vpinsrd_avx(auVar11,(uVar8 & 0x1ff) << 4,2);
  auVar10 = vpand_avx(auVar9,auVar11);
  auVar4 = vpor_avx(auVar9,auVar4);
  auVar10 = vpblendd_avx2(auVar10,auVar4,4);
  *(undefined1 (*) [16])(out + 10) = auVar10;
  out[0xe] = uVar8 >> 0x16 | (uVar2 & 7) << 10;
  out[0xf] = uVar2 >> 3 & 0x1fff;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack13_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 13);
  out++;
  *out = ((*in) >> 13) % (1U << 13);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 7)) << (13 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 13);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 1)) << (13 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 13);
  out++;
  *out = ((*in) >> 14) % (1U << 13);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 8)) << (13 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 13);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 2)) << (13 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 13);
  out++;
  *out = ((*in) >> 15) % (1U << 13);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 9)) << (13 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 13);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 3)) << (13 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 13);
  out++;

  return in + 1;
}